

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astReturnNode_primitiveMacro
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  undefined1 local_68 [8];
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_16_2_e57137d2 gcFrame;
  sysbvm_tuple_t *expression;
  sysbvm_tuple_t *macroContext;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  memset(&gcFrameRecord.roots,0,0x10);
  memset(local_68,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_68);
  gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_macroContext_getSourcePosition(*arguments);
  sVar1 = sysbvm_astReturnNode_create(context,(sysbvm_tuple_t)gcFrameRecord.roots,arguments[1]);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_68);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_astReturnNode_primitiveMacro(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *macroContext = &arguments[0];
    sysbvm_tuple_t *expression = &arguments[1];

    struct {
        sysbvm_tuple_t sourcePosition;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.sourcePosition = sysbvm_macroContext_getSourcePosition(*macroContext);
    gcFrame.result = sysbvm_astReturnNode_create(context, gcFrame.sourcePosition, *expression);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}